

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O0

void testStandardAttributes(string *tempDir)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__rhs;
  ostream *this;
  exception *e;
  string filename_3;
  string filename_2;
  string filename_1;
  string fn2_1;
  string fn1_1;
  string fn2;
  string fn1;
  string filename;
  char *in_stack_00000178;
  char *in_stack_00000180;
  char *in_stack_00000218;
  char *in_stack_00000220;
  char *in_stack_00000310;
  char *in_stack_00000350;
  char *in_stack_00000360;
  char *in_stack_00000370;
  char *in_stack_fffffffffffffed0;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<((ostream *)&std::cout,"Testing optional standard attributes");
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_20fd4e::convertRGBtoXYZ();
  std::operator+(__lhs,in_stack_fffffffffffffed0);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_20fd4e::writeReadChromaticities(in_stack_00000370);
  std::__cxx11::string::~string(local_38);
  std::operator+(__lhs,in_stack_fffffffffffffed0);
  std::operator+(__lhs,in_stack_fffffffffffffed0);
  __rhs = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_20fd4e::latLongMap(in_stack_00000180,in_stack_00000178);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::operator+(__lhs,__rhs);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_20fd4e::cubeMap(in_stack_00000220,in_stack_00000218);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_20fd4e::writeReadKeyCode(in_stack_00000360);
  std::__cxx11::string::~string(local_d8);
  anon_unknown.dwarf_20fd4e::timeCodeMethods();
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_20fd4e::writeReadTimeCode(in_stack_00000310);
  std::__cxx11::string::~string(local_f8);
  anon_unknown.dwarf_20fd4e::rationalMethods();
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_20fd4e::writeReadRational(in_stack_00000350);
  std::__cxx11::string::~string(local_118);
  anon_unknown.dwarf_20fd4e::generatedFunctions();
  this = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testStandardAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing optional standard attributes" << endl;

        convertRGBtoXYZ ();

        {
            std::string filename = tempDir + "imf_test_chromaticities.exr";
            writeReadChromaticities (filename.c_str ());
        }

        {
            std::string fn1 = tempDir + "imf_test_latlong1.exr";
            std::string fn2 = tempDir + "imf_test_latlong2.exr";
            latLongMap (fn1.c_str (), fn2.c_str ());
        }

        {
            std::string fn1 = tempDir + "imf_test_cube1.exr";
            std::string fn2 = tempDir + "imf_test_cube2.exr";
            cubeMap (fn1.c_str (), fn2.c_str ());
        }

        {
            std::string filename = tempDir + "imf_test_keycode.exr";
            writeReadKeyCode (filename.c_str ());
        }

        {
            timeCodeMethods ();
            std::string filename = tempDir + "imf_test_timecode.exr";
            writeReadTimeCode (filename.c_str ());
        }

        {
            rationalMethods ();
            std::string filename = tempDir + "imf_test_rational.exr";
            writeReadRational (filename.c_str ());
        }

        generatedFunctions ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}